

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_serialization_unit_test.cpp
# Opt level: O0

void __thiscall
simplex_tree_deserialization_exception<Gudhi::Simplex_tree<Low_options>_>::test_method
          (simplex_tree_deserialization_exception<Gudhi::Simplex_tree<Low_options>_> *this)

{
  undefined8 uVar1;
  bool bVar2;
  ostream *poVar3;
  void *pvVar4;
  lazy_ostream *prev;
  invalid_argument *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[56],_const_char_(&)[56]> local_250;
  assertion_result local_230;
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8 [2];
  basic_cstring<const_char> local_1d8;
  undefined1 local_1c8 [8];
  Simplex_tree<Low_options> st;
  ulong local_130;
  size_t idx;
  char buffer [256];
  size_t too_long_buffer_size;
  simplex_tree_deserialization_exception<Gudhi::Simplex_tree<Low_options>_> *this_local;
  
  memset(&idx,0,0x100);
  std::operator<<((ostream *)&std::clog,"Deserialization of a too long buffer:\n");
  for (local_130 = 0; local_130 < 0x100; local_130 = local_130 + 1) {
    st._143_1_ = std::setfill<char>('0');
    poVar3 = std::operator<<(&std::clog,st._143_1_);
    st.dimension_ = (int)std::setw(2);
    poVar3 = std::operator<<(poVar3,(_Setw)st.dimension_);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::uppercase);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar4,(uint)(byte)buffer[local_130 - 8]);
    poVar3 = std::operator<<(poVar3," ");
    std::ostream::operator<<(poVar3,std::dec);
  }
  std::ostream::operator<<(&std::clog,std::endl<char,std::char_traits<char>>);
  Gudhi::Simplex_tree<Low_options>::Simplex_tree((Simplex_tree<Low_options> *)local_1c8);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
               ,0x84);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1d8,0x112,local_1f8);
    Gudhi::Simplex_tree<Low_options>::deserialize
              ((Simplex_tree<Low_options> *)local_1c8,(char *)&idx,0x100);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
                 ,0x84);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_218);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_208,0x112,&local_218);
      boost::test_tools::assertion_result::assertion_result(&local_230,false);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_250,prev,
                 (char (*) [56])"exception std::invalid_argument expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_serialization_unit_test.cpp"
                 ,0x84);
      boost::test_tools::tt_detail::report_assertion(&local_230,&local_250,&ex,0x112,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[56],_const_char_(&)[56]>::
      ~lazy_ostream_impl(&local_250);
      boost::test_tools::assertion_result::~assertion_result(&local_230);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::Simplex_tree<Low_options>::~Simplex_tree((Simplex_tree<Low_options> *)local_1c8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(simplex_tree_deserialization_exception, Stree, list_of_tested_variants) {
  const std::size_t too_long_buffer_size = 256;
  char buffer[too_long_buffer_size]{};

  std::clog << "Deserialization of a too long buffer:\n";
  for (std::size_t idx = 0; idx < too_long_buffer_size; idx++) {
    std::clog << std::setfill('0') 
              << std::setw(2) 
              << std::uppercase 
              << std::hex << (0xFF & buffer[idx]) << " " << std::dec;
  }
  std::clog << std::endl;
  Stree st;
  BOOST_CHECK_THROW(st.deserialize(buffer, too_long_buffer_size), std::invalid_argument);
}